

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

int aom_satd_sse2(tran_low_t *coeff,int length)

{
  longlong in_RCX;
  longlong in_RDX;
  int iVar1;
  longlong in_RSI;
  longlong in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i sign;
  __m128i alVar2;
  __m128i hi;
  __m128i abs_coeff;
  __m128i coeff_sign;
  __m128i src_line;
  __m128i accum;
  __m128i zero;
  int i;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_f8;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  iVar1 = (int)in_RSI;
  local_118 = 0;
  uStack_114 = 0;
  uStack_110 = 0;
  uStack_10c = 0;
  for (local_f8 = 0; local_f8 < iVar1; local_f8 = local_f8 + 4) {
    alVar2[1] = in_RSI;
    alVar2[0] = in_RDI;
    sign[1] = in_RCX;
    sign[0] = in_RDX;
    alVar2 = invert_sign_32_sse2(alVar2,sign);
    in_RDX = alVar2[1];
    local_48 = (int)extraout_XMM0_Qa;
    uStack_44 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
    uStack_40 = (int)extraout_XMM0_Qb;
    uStack_3c = (int)((ulong)extraout_XMM0_Qb >> 0x20);
    local_118 = local_118 + local_48;
    uStack_114 = uStack_114 + uStack_44;
    uStack_110 = uStack_110 + uStack_40;
    uStack_10c = uStack_10c + uStack_3c;
  }
  return local_118 + uStack_110 + uStack_114 + uStack_10c;
}

Assistant:

int aom_satd_sse2(const tran_low_t *coeff, int length) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  __m128i accum = zero;

  for (i = 0; i < length; i += 4) {
    const __m128i src_line = _mm_load_si128((const __m128i *)coeff);
    const __m128i coeff_sign = _mm_srai_epi32(src_line, 31);
    const __m128i abs_coeff = invert_sign_32_sse2(src_line, coeff_sign);
    accum = _mm_add_epi32(accum, abs_coeff);
    coeff += 4;
  }

  {  // cascading summation of accum
    __m128i hi = _mm_srli_si128(accum, 8);
    accum = _mm_add_epi32(accum, hi);
    hi = _mm_srli_epi64(accum, 32);
    accum = _mm_add_epi32(accum, hi);
  }

  return _mm_cvtsi128_si32(accum);
}